

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void ReadArrayVars(PNGHandle *png,FWorldGlobalArray *vars,size_t count,DWORD id)

{
  uint uVar1;
  DWORD DVar2;
  DWORD DVar3;
  DWORD DVar4;
  DWORD key;
  ulong uVar5;
  ulong uVar6;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *pTVar7;
  bool bVar8;
  SDWORD val;
  FPNGChunkArchive arc;
  DWORD local_344;
  PNGHandle *local_340;
  FWorldGlobalArray *local_338;
  FPNGChunkArchive local_330;
  
  local_340 = png;
  uVar1 = M_FindPNGChunk(png,id);
  if (count != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pTVar7 = vars + uVar5;
      M_Free(pTVar7->Nodes);
      pTVar7->Nodes = (Node *)0x0;
      pTVar7->LastFree = (Node *)0x0;
      pTVar7->Size = 0;
      pTVar7->NumUsed = 0;
      TMap<int,_int,_THashTraits<int>,_InitIntToZero>::SetNodeVector(pTVar7,1);
      bVar8 = uVar6 < count;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar8);
  }
  if ((ulong)uVar1 != 0) {
    local_338 = vars;
    FPNGChunkArchive::FPNGChunkArchive(&local_330,local_340->File->File,id,(ulong)uVar1);
    DVar2 = FArchive::ReadCount(&local_330.super_FArchive);
    DVar3 = FArchive::ReadCount(&local_330.super_FArchive);
    if (DVar2 <= DVar3) {
      do {
        DVar4 = FArchive::ReadCount(&local_330.super_FArchive);
        if (DVar4 != 0) {
          pTVar7 = local_338 + DVar2;
          do {
            key = FArchive::ReadCount(&local_330.super_FArchive);
            local_344 = FArchive::ReadCount(&local_330.super_FArchive);
            TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Insert(pTVar7,key,(int *)&local_344);
            DVar4 = DVar4 - 1;
          } while (DVar4 != 0);
        }
        DVar2 = DVar2 + 1;
      } while (DVar2 <= DVar3);
    }
    FileReader::ResetFilePtr(local_340->File);
    FPNGChunkArchive::~FPNGChunkArchive(&local_330);
  }
  return;
}

Assistant:

static void ReadArrayVars (PNGHandle *png, FWorldGlobalArray *vars, size_t count, DWORD id)
{
	size_t len = M_FindPNGChunk (png, id);
	unsigned int i, k;

	for (i = 0; i < count; ++i)
	{
		vars[i].Clear ();
	}

	if (len != 0)
	{
		DWORD max, size;
		FPNGChunkArchive arc (png->File->GetFile(), id, len);

		i = arc.ReadCount ();
		max = arc.ReadCount ();

		for (; i <= max; ++i)
		{
			size = arc.ReadCount ();
			for (k = 0; k < size; ++k)
			{
				SDWORD key, val;
				key = arc.ReadCount();

				val = arc.ReadCount();
				vars[i].Insert (key, val);
			}
		}
		png->File->ResetFilePtr();
	}
}